

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

parasail_matrix_t * parasail_matrix_from_file_internal(char *filename,int case_sensitive)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  undefined4 uVar4;
  ushort **ppuVar5;
  size_t __size;
  int local_d0;
  int local_cc;
  int local_c4;
  int retcode;
  int val;
  size_t j;
  parasail_file_t *ppStack_b0;
  int type;
  size_t c;
  int min;
  int max;
  size_t asize;
  size_t count;
  off_t oStack_88;
  int first_alpha;
  off_t size;
  off_t i;
  char *T;
  parasail_file_t *pf;
  size_t alphabet_query_capacity;
  size_t alphabet_query_i;
  char *alphabet_query;
  char *alphabet;
  int *mapper;
  size_t matrix_capacity;
  size_t matrix_i;
  int *matrix;
  parasail_matrix_t *retval;
  char *pcStack_18;
  int case_sensitive_local;
  char *filename_local;
  
  matrix = (int *)0x0;
  matrix_i = 0;
  matrix_capacity = 0;
  mapper = (int *)0x0;
  alphabet = (char *)0x0;
  alphabet_query = (char *)0x0;
  alphabet_query_i = 0;
  alphabet_query_capacity = 0;
  pf = (parasail_file_t *)0x0;
  T = (char *)0x0;
  i = 0;
  size = 0;
  oStack_88 = 0;
  count._4_4_ = 1;
  asize = 0;
  _min = (parasail_file_t *)0x0;
  c._4_4_ = -0x80000000;
  c._0_4_ = 0x7fffffff;
  ppStack_b0 = (parasail_file_t *)0x0;
  j._4_4_ = 0;
  retval._4_4_ = case_sensitive;
  pcStack_18 = filename;
  if (filename == (char *)0x0) {
    fprintf(_stderr,"parasail_matrix_from_file: NULL pointer\n");
    filename_local = (char *)0x0;
  }
  else {
    T = (char *)parasail_open(filename);
    if ((parasail_file_t *)T == (parasail_file_t *)0x0) {
      fprintf(_stderr,"parasail_matrix_from_file: parasail_open(%s) failed\n",pcStack_18);
      filename_local = (char *)0x0;
    }
    else {
      i = (off_t)((parasail_file_t *)T)->buf;
      oStack_88 = ((parasail_file_t *)T)->size;
      for (; size < oStack_88; size = size + 1) {
        if (*(char *)(i + size) == '#') {
          size = skip_line((char *)i,size);
        }
        else {
          ppuVar5 = __ctype_b_loc();
          if (((((*ppuVar5)[(int)*(char *)(i + size)] & 8) == 0) && (*(char *)(i + size) != '*')) &&
             (*(char *)(i + size) != '-')) {
            if ((*(char *)(i + size) == '\n') || (*(char *)(i + size) == '\r')) {
              if ((size + 1 < oStack_88) &&
                 ((*(char *)(i + 1 + size) == '\n' || (*(char *)(i + 1 + size) == '\r')))) {
                size = size + 1;
              }
            }
            else if ((*(char *)(i + size) != ' ') && (*(char *)(i + size) != '\t')) {
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)*(char *)(i + size)] & 0x4000) != 0) {
                fprintf(_stderr,
                        "parasail_matrix_from_file: non-alpha character in matrix file (\'%c\')\n",
                        (ulong)(uint)(int)*(char *)(i + size));
                if (alphabet_query != (char *)0x0) {
                  free(alphabet_query);
                }
                if (alphabet_query_i != 0) {
                  free((void *)alphabet_query_i);
                }
                if (matrix_i != 0) {
                  free((void *)matrix_i);
                }
                parasail_close((parasail_file_t *)T);
                return (parasail_matrix_t *)0x0;
              }
              fprintf(_stderr,
                      "parasail_matrix_from_file: non-printing character in matrix file (\'%d\')\n",
                      (ulong)(uint)(int)*(char *)(i + size));
              if (alphabet_query != (char *)0x0) {
                free(alphabet_query);
              }
              if (alphabet_query_i != 0) {
                free((void *)alphabet_query_i);
              }
              if (matrix_i != 0) {
                free((void *)matrix_i);
              }
              parasail_close((parasail_file_t *)T);
              return (parasail_matrix_t *)0x0;
            }
          }
          else if (count._4_4_ == 0) {
            _retcode = (parasail_file_t *)0x0;
            if (pf <= alphabet_query_capacity) {
              pf = (parasail_file_t *)((long)pf * 2);
              alphabet_query_i =
                   (size_t)realloc((void *)alphabet_query_i,(size_t)((long)&pf->fd + 1));
              if ((void *)alphabet_query_i == (void *)0x0) {
                perror("realloc");
                fprintf(_stderr,"parasail_matrix_from_file: couldn\'t grow query size\n");
                if (alphabet_query != (char *)0x0) {
                  free(alphabet_query);
                }
                if (alphabet_query_i != 0) {
                  free((void *)alphabet_query_i);
                }
                if (matrix_i != 0) {
                  free((void *)matrix_i);
                }
                parasail_close((parasail_file_t *)T);
                return (parasail_matrix_t *)0x0;
              }
            }
            asize = asize + 1;
            ppuVar5 = __ctype_b_loc();
            if ((((*ppuVar5)[(int)*(char *)(i + size)] & 0x400) == 0) &&
               (*(char *)(i + size) != '*')) {
              *(undefined1 *)(alphabet_query_i + alphabet_query_capacity) = 0x2a;
            }
            else {
              *(undefined1 *)(alphabet_query_i + alphabet_query_capacity) =
                   *(undefined1 *)(i + size);
              size = size + 1;
            }
            alphabet_query_capacity = alphabet_query_capacity + 1;
            for (_retcode = (parasail_file_t *)0x0; _retcode < _min;
                _retcode = (parasail_file_t *)((long)&_retcode->fd + 1)) {
              local_c4 = 0;
              iVar3 = get_num((char *)i,&size,&local_c4);
              if (iVar3 == -1) {
                fprintf(_stderr,"parasail_matrix_from_file: poorly formed matrix file\n");
                if (alphabet_query != (char *)0x0) {
                  free(alphabet_query);
                }
                if (alphabet_query_i != 0) {
                  free((void *)alphabet_query_i);
                }
                if (matrix_i != 0) {
                  free((void *)matrix_i);
                }
                parasail_close((parasail_file_t *)T);
                return (parasail_matrix_t *)0x0;
              }
              if (mapper <= matrix_capacity) {
                __size = (long)mapper << 3;
                mapper = (int *)((long)mapper << 1);
                matrix_i = (size_t)realloc((void *)matrix_i,__size);
                if ((void *)matrix_i == (void *)0x0) {
                  perror("realloc");
                  fprintf(_stderr,"parasail_matrix_from_file: couldn\'t grow matrix size\n");
                  if (alphabet_query != (char *)0x0) {
                    free(alphabet_query);
                  }
                  if (alphabet_query_i != 0) {
                    free((void *)alphabet_query_i);
                  }
                  if (matrix_i != 0) {
                    free((void *)matrix_i);
                  }
                  parasail_close((parasail_file_t *)T);
                  return (parasail_matrix_t *)0x0;
                }
              }
              *(int *)(matrix_i + matrix_capacity * 4) = local_c4;
              if (c._4_4_ < local_c4) {
                local_cc = local_c4;
              }
              else {
                local_cc = c._4_4_;
              }
              c._4_4_ = local_cc;
              if (local_c4 < (int)c) {
                local_d0 = local_c4;
              }
              else {
                local_d0 = (int)c;
              }
              c._0_4_ = local_d0;
              matrix_capacity = matrix_capacity + 1;
            }
          }
          else {
            count._4_4_ = 0;
            alphabet_query = get_alphabet((char *)i,size,oStack_88);
            if (alphabet_query == (char *)0x0) {
              fprintf(_stderr,"parasail_matrix_from_file: poorly formed matrix file alphabet\n");
              parasail_close((parasail_file_t *)T);
              return (parasail_matrix_t *)0x0;
            }
            _min = (parasail_file_t *)strlen(alphabet_query);
            mapper = (int *)((long)_min * (long)_min);
            matrix_i = (size_t)malloc((long)mapper * 4);
            if ((void *)matrix_i == (void *)0x0) {
              perror("malloc");
              fprintf(_stderr,"parasail_matrix_from_file: cannont malloc buffer for matrix\n");
              free(alphabet_query);
              parasail_close((parasail_file_t *)T);
              return (parasail_matrix_t *)0x0;
            }
            pf = _min;
            alphabet_query_i = (size_t)malloc((size_t)((long)&_min->fd + 1));
            if ((void *)alphabet_query_i == (void *)0x0) {
              perror("malloc");
              fprintf(_stderr,
                      "parasail_matrix_from_file: cannont malloc buffer for matrix alphabet\n");
              free((void *)matrix_i);
              free(alphabet_query);
              parasail_close((parasail_file_t *)T);
              return (parasail_matrix_t *)0x0;
            }
            size = skip_line((char *)i,size);
          }
        }
      }
      parasail_close((parasail_file_t *)T);
      *(undefined1 *)(alphabet_query_i + alphabet_query_capacity) = 0;
      if ((_min == (parasail_file_t *)alphabet_query_capacity) &&
         (iVar3 = strcmp(alphabet_query,(char *)alphabet_query_i), iVar3 == 0)) {
        if (matrix_capacity != (long)_min * (long)_min) {
          fprintf(_stderr,"parasail_matrix_from_file: matrix is missing values\n");
          free(alphabet_query);
          free((void *)alphabet_query_i);
          free((void *)matrix_i);
          return (parasail_matrix_t *)0x0;
        }
        if ((parasail_file_t *)asize != _min) {
          fprintf(_stderr,"parasail_matrix_from_file: matrix is missing rows\n");
          free(alphabet_query);
          free((void *)alphabet_query_i);
          free((void *)matrix_i);
          return (parasail_matrix_t *)0x0;
        }
      }
      else {
        j._4_4_ = 1;
        if (matrix_capacity != (long)_min * asize) {
          fprintf(_stderr,"parasail_matrix_from_file: matrix is missing values\n");
          free(alphabet_query);
          free((void *)alphabet_query_i);
          free((void *)matrix_i);
          return (parasail_matrix_t *)0x0;
        }
      }
      alphabet = (char *)malloc(0x400);
      if ((int *)alphabet == (int *)0x0) {
        perror("malloc");
        fprintf(_stderr,
                "parasail_matrix_from_file: cannont malloc mapper buffer for matrix file `%s\'\n",
                pcStack_18);
        free(alphabet_query);
        free((void *)alphabet_query_i);
        free((void *)matrix_i);
        filename_local = (char *)0x0;
      }
      else {
        parasail_memset_int((int *)alphabet,(int)_min + -1,0x100);
        if (retval._4_4_ == 0) {
          for (ppStack_b0 = (parasail_file_t *)0x0; pcVar1 = alphabet, ppStack_b0 < _min;
              ppStack_b0 = (parasail_file_t *)((long)&ppStack_b0->fd + 1)) {
            uVar4 = SUB84(ppStack_b0,0);
            iVar3 = toupper((uint)(byte)alphabet_query[(long)ppStack_b0]);
            pcVar2 = alphabet;
            *(undefined4 *)(pcVar1 + (long)iVar3 * 4) = uVar4;
            uVar4 = SUB84(ppStack_b0,0);
            iVar3 = tolower((uint)(byte)alphabet_query[(long)ppStack_b0]);
            *(undefined4 *)(pcVar2 + (long)iVar3 * 4) = uVar4;
          }
        }
        else {
          for (ppStack_b0 = (parasail_file_t *)0x0; ppStack_b0 < _min;
              ppStack_b0 = (parasail_file_t *)((long)&ppStack_b0->fd + 1)) {
            *(int *)(alphabet + (ulong)(byte)alphabet_query[(long)ppStack_b0] * 4) = (int)ppStack_b0
            ;
          }
        }
        matrix = (int *)malloc(0x48);
        if (matrix == (int *)0x0) {
          perror("malloc");
          fprintf(_stderr,"parasail_matrix_from_file: cannont malloc buffer for matrix file `%s\'\n"
                  ,pcStack_18);
          free((void *)matrix_i);
          filename_local = (char *)0x0;
        }
        else {
          *(char **)matrix = pcStack_18;
          *(size_t *)(matrix + 2) = matrix_i;
          *(char **)(matrix + 4) = alphabet;
          matrix[6] = (int)_min;
          matrix[7] = c._4_4_;
          matrix[8] = (int)c;
          *(size_t *)(matrix + 10) = matrix_i;
          matrix[0xc] = j._4_4_;
          matrix[0xd] = (int)asize;
          *(char **)(matrix + 0xe) = alphabet_query;
          *(size_t *)(matrix + 0x10) = alphabet_query_i;
          filename_local = (char *)matrix;
        }
      }
    }
  }
  return (parasail_matrix_t *)filename_local;
}

Assistant:

static parasail_matrix_t* parasail_matrix_from_file_internal(const char *filename, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    size_t matrix_i = 0;
    size_t matrix_capacity = 0;
    int *mapper = NULL;
    char *alphabet = NULL;
    char *alphabet_query = NULL;
    size_t alphabet_query_i = 0;
    size_t alphabet_query_capacity = 0;
    parasail_file_t *pf = NULL;
    const char *T = NULL;
    off_t i = 0;
    off_t size = 0;
    int first_alpha = 1;
    size_t count = 0;
    size_t asize = 0;
    int max = INT_MIN;
    int min = INT_MAX;
    size_t c = 0;
    int type = PARASAIL_MATRIX_TYPE_SQUARE;

    if (NULL == filename) {
        fprintf(stderr, "parasail_matrix_from_file: NULL pointer\n");
        return NULL;
    }

    pf = parasail_open(filename);
    if (NULL == pf) {
        fprintf(stderr, "parasail_matrix_from_file: "
                "parasail_open(%s) failed\n", filename);
        return NULL;
    }
    T = pf->buf;
    size = pf->size;

    while (i<size) {
        if (T[i] == '#') {
            /* ignore comments */
            i = skip_line(T, i);
        }
        else if (isalnum(T[i]) || T[i] == '*' || T[i] == '-') {
            if (first_alpha) {
                first_alpha = 0;
                alphabet = get_alphabet(T, i, size);
                if (NULL == alphabet) {
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "poorly formed matrix file alphabet\n");
                    parasail_close(pf);
                    return NULL;
                }
                asize = strlen(alphabet);
                matrix_capacity = asize*asize;
                matrix = (int*)malloc(sizeof(int)*matrix_capacity);
                if (NULL == matrix) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix\n");
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                alphabet_query_capacity = asize;
                alphabet_query = (char*)malloc(sizeof(char)*(alphabet_query_capacity+1));
                if (NULL == alphabet_query) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix alphabet\n");
                    free(matrix);
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                i = skip_line(T, i);
            }
            else {
                size_t j=0;
                /* store the letter */
                if (alphabet_query_i >= alphabet_query_capacity) {
                    alphabet_query_capacity *= 2;
                    alphabet_query = realloc(alphabet_query, sizeof(char)*(alphabet_query_capacity+1));
                    if (NULL == alphabet_query) {
                        perror("realloc");
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "couldn't grow query size\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                }
                ++count;
                /* allow PSSM matrix to omit query */
                if (isalpha(T[i]) || T[i] == '*') {
                    alphabet_query[alphabet_query_i++] = T[i];
                    ++i; /* skip over the letter */
                }
                else {
                    alphabet_query[alphabet_query_i++] = '*';
                    /* don't increment read index i */
                }
                for (j=0; j<asize; ++j) {
                    int val = 0;
                    int retcode = get_num(T, &i, &val);
                    if (-1 == retcode) {
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "poorly formed matrix file\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                    if (matrix_i >= matrix_capacity) {
                        matrix_capacity *= 2;
                        matrix = realloc(matrix, sizeof(int)*matrix_capacity);
                        if (NULL == matrix) {
                            perror("realloc");
                            fprintf(stderr, "parasail_matrix_from_file: "
                                    "couldn't grow matrix size\n");
                            if (alphabet) free(alphabet);
                            if (alphabet_query) free(alphabet_query);
                            if (matrix) free(matrix);
                            parasail_close(pf);
                            return NULL;
                        }
                    }
                    matrix[matrix_i++] = val;
                    max = val > max ? val : max;
                    min = val < min ? val : min;
                }
            }
        }
        else if (T[i] == '\n' || T[i] == '\r') {
            /* ignore newline */
            /* for the case of "\r\n" or "\n\r" */
            if (i+1<size && (T[i+1] == '\n' || T[i+1] == '\r')) {
                ++i;
            }
        }
        else if (T[i] == ' ' || T[i] == '\t') {
            /* ignore spaces and tabs */
        }
        else if (isprint(T[i])) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-alpha character in matrix file ('%c')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        else {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-printing character in matrix file ('%d')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        ++i;
    }

    parasail_close(pf);

    /* we consider this a square matrix if alphabet sizes match and are identical */
    alphabet_query[alphabet_query_i] = '\0';
    if (asize == alphabet_query_i && 0 == strcmp(alphabet, alphabet_query)) {
        /* square */
        if (matrix_i != asize*asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
        if (count != asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing rows\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }
    else {
        /* PSSM */
        type = PARASAIL_MATRIX_TYPE_PSSM;
        if (matrix_i != asize*count) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }

    mapper = (int*)malloc(sizeof(int)*256);
    if (NULL == mapper) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc mapper buffer for matrix file `%s'\n",
                filename);
        free(alphabet);
        free(alphabet_query);
        free(matrix);
        return NULL;
    }
    parasail_memset_int(mapper, asize-1, 256);
    if (case_sensitive) {
        for (c=0; c<asize; ++c) {
            mapper[(unsigned char)alphabet[c]] = (int)c;
        }
    }
    else {
        for (c=0; c<asize; ++c) {
            mapper[toupper((unsigned char)alphabet[c])] = (int)c;
            mapper[tolower((unsigned char)alphabet[c])] = (int)c;
        }
    }

    retval = (parasail_matrix_t*)malloc(sizeof(parasail_matrix_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc buffer for matrix file `%s'\n", filename);
        free(matrix);
        return NULL;
    }

    retval->name = filename;
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)asize;
    retval->max = max;
    retval->min = min;
    retval->user_matrix = matrix;
    retval->type = type;
    retval->length = (int)count;
    retval->alphabet = alphabet;
    retval->query = alphabet_query;
    return retval;
}